

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_avx2.c
# Opt level: O3

_Bool av1_resize_vert_dir_avx2
                (uint8_t *intbuf,uint8_t *output,int out_stride,int height,int height2,int stride,
                int start_col)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  _Bool _Var9;
  int iVar10;
  undefined1 (*pauVar11) [16];
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined1 (*pauVar16) [16];
  uint uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  uint8_t *puVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  
  auVar37 = in_ZMM9._32_32_;
  if (7 < height && (height & 1U) == 0) {
    uVar17 = stride + 0xf;
    if (-1 < stride) {
      uVar17 = stride;
    }
    iVar14 = stride % 0x10;
    iVar10 = (height & 2U) + 4;
    lVar12 = (long)stride;
    if (start_col < (int)(uVar17 & 0xfffffff0)) {
      uVar19 = height - 1;
      lVar18 = (long)start_col;
      pauVar16 = (undefined1 (*) [16])(output + lVar18);
      auVar40 = ZEXT3264(CONCAT230(0xc38,CONCAT228(0xc38,CONCAT226(0xc38,CONCAT224(0xc38,CONCAT222(
                                                  0xc38,CONCAT220(0xc38,CONCAT218(0xc38,CONCAT216(
                                                  0xc38,CONCAT214(0xc38,CONCAT212(0xc38,CONCAT210(
                                                  0xc38,CONCAT28(0xc38,0xc380c380c380c38))))))))))))
                        );
      auVar46 = ZEXT3264(CONCAT428(0x40,CONCAT424(0x40,CONCAT420(0x40,CONCAT416(0x40,CONCAT412(0x40,
                                                  CONCAT48(0x40,0x4000000040)))))));
      do {
        auVar32 = *(undefined1 (*) [16])(intbuf + lVar18);
        auVar25 = *(undefined1 (*) [16])(intbuf + lVar12 + lVar18);
        auVar24 = *(undefined1 (*) [16])(intbuf + lVar12 * 2 + lVar18);
        auVar61 = *(undefined1 (*) [16])(intbuf + lVar12 * 3 + lVar18);
        auVar60 = ZEXT1664(auVar61);
        auVar41 = *(undefined1 (*) [16])(intbuf + lVar12 * 4 + lVar18);
        auVar69 = ZEXT1664(auVar41);
        auVar26._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar32;
        auVar26._16_16_ = ZEXT116(1) * auVar25;
        auVar64._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar32;
        auVar64._16_16_ = ZEXT116(1) * auVar24;
        auVar66._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar25;
        auVar66._16_16_ = ZEXT116(1) * auVar61;
        auVar70._0_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar24;
        auVar70._16_16_ = ZEXT116(1) * auVar41;
        auVar25 = vpunpcklbw_avx(auVar32,auVar32);
        auVar57 = vpermq_avx2(ZEXT1632(auVar25),0x44);
        auVar37 = vpunpcklbw_avx2(auVar26,auVar64);
        auVar51 = ZEXT3264(auVar37);
        auVar37 = vpunpcklbw_avx2(auVar66,auVar70);
        auVar63 = ZEXT3264(auVar37);
        auVar32 = vpunpckhbw_avx(auVar32,auVar32);
        auVar37 = vpermq_avx2(ZEXT1632(auVar32),0x44);
        auVar48 = ZEXT3264(auVar37);
        auVar37 = vpunpckhbw_avx2(auVar26,auVar64);
        auVar56 = ZEXT3264(auVar37);
        auVar37 = vpunpckhbw_avx2(auVar66,auVar70);
        auVar68 = ZEXT3264(auVar37);
        uVar21 = 0;
        pauVar11 = pauVar16;
        do {
          auVar37 = auVar63._0_32_;
          iVar15 = (int)uVar21;
          uVar4 = iVar15 + 5U;
          if ((int)uVar19 < (int)(iVar15 + 5U)) {
            uVar4 = uVar19;
          }
          uVar5 = iVar15 + 6U;
          if ((int)uVar19 < (int)(iVar15 + 6U)) {
            uVar5 = uVar19;
          }
          auVar32 = *(undefined1 (*) [16])(intbuf + (int)(uVar4 * stride) + lVar18);
          auVar25 = *(undefined1 (*) [16])(intbuf + (int)(uVar5 * stride) + lVar18);
          auVar52._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar60._0_16_;
          auVar52._16_16_ = ZEXT116(0) * auVar60._16_16_ + ZEXT116(1) * auVar32;
          auVar39._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar69._0_16_;
          auVar39._16_16_ = ZEXT116(0) * auVar69._16_16_ + ZEXT116(1) * auVar25;
          auVar44 = auVar46._0_32_;
          auVar2._8_2_ = 0x380c;
          auVar2._0_8_ = 0x380c380c380c380c;
          auVar2._10_2_ = 0x380c;
          auVar2._12_2_ = 0x380c;
          auVar2._14_2_ = 0x380c;
          auVar2._16_2_ = 0x380c;
          auVar2._18_2_ = 0x380c;
          auVar2._20_2_ = 0x380c;
          auVar2._22_2_ = 0x380c;
          auVar2._24_2_ = 0x380c;
          auVar2._26_2_ = 0x380c;
          auVar2._28_2_ = 0x380c;
          auVar2._30_2_ = 0x380c;
          auVar26 = vpmaddubsw_avx2(auVar51._0_32_,auVar2);
          auVar64 = vpunpcklbw_avx2(auVar52,auVar39);
          auVar51 = ZEXT3264(auVar64);
          auVar52 = vpunpckhbw_avx2(auVar52,auVar39);
          auVar3._8_2_ = 0xfdff;
          auVar3._0_8_ = 0xfdfffdfffdfffdff;
          auVar3._10_2_ = 0xfdff;
          auVar3._12_2_ = 0xfdff;
          auVar3._14_2_ = 0xfdff;
          auVar3._16_2_ = 0xfdff;
          auVar3._18_2_ = 0xfdff;
          auVar3._20_2_ = 0xfdff;
          auVar3._22_2_ = 0xfdff;
          auVar3._24_2_ = 0xfdff;
          auVar3._26_2_ = 0xfdff;
          auVar3._28_2_ = 0xfdff;
          auVar3._30_2_ = 0xfdff;
          auVar57 = vpmaddubsw_avx2(auVar57,auVar3);
          auVar57 = vpaddw_avx2(auVar26,auVar57);
          auVar39 = auVar40._0_32_;
          auVar26 = vpmaddubsw_avx2(auVar37,auVar39);
          auVar7._8_2_ = 0xfffd;
          auVar7._0_8_ = 0xfffdfffdfffdfffd;
          auVar7._10_2_ = 0xfffd;
          auVar7._12_2_ = 0xfffd;
          auVar7._14_2_ = 0xfffd;
          auVar7._16_2_ = 0xfffd;
          auVar7._18_2_ = 0xfffd;
          auVar7._20_2_ = 0xfffd;
          auVar7._22_2_ = 0xfffd;
          auVar7._24_2_ = 0xfffd;
          auVar7._26_2_ = 0xfffd;
          auVar7._28_2_ = 0xfffd;
          auVar7._30_2_ = 0xfffd;
          auVar64 = vpmaddubsw_avx2(auVar64,auVar7);
          auVar26 = vpaddw_avx2(auVar64,auVar26);
          auVar64 = vpmovsxwd_avx2(auVar57._0_16_);
          auVar66 = vpmovsxwd_avx2(auVar26._0_16_);
          auVar64 = vpaddd_avx2(auVar64,auVar44);
          auVar64 = vpaddd_avx2(auVar64,auVar66);
          auVar66 = vpmaddubsw_avx2(auVar56._0_32_,auVar2);
          auVar46 = ZEXT3264(auVar44);
          auVar70 = vpmaddubsw_avx2(auVar48._0_32_,auVar3);
          auVar56 = ZEXT3264(auVar52);
          auVar48 = ZEXT3264(auVar68._0_32_);
          auVar57 = vpmovsxwd_avx2(auVar57._16_16_);
          auVar26 = vpmovsxwd_avx2(auVar26._16_16_);
          auVar57 = vpaddd_avx2(auVar57,auVar44);
          auVar57 = vpaddd_avx2(auVar57,auVar26);
          auVar26 = vpsrad_avx2(auVar64,7);
          auVar57 = vpsrad_avx2(auVar57,7);
          auVar57 = vpackusdw_avx2(auVar26,auVar57);
          auVar26 = vpaddw_avx2(auVar66,auVar70);
          auVar64 = vpmaddubsw_avx2(auVar68._0_32_,auVar39);
          auVar66 = vpmaddubsw_avx2(auVar52,auVar7);
          auVar40 = ZEXT3264(auVar39);
          auVar64 = vpaddw_avx2(auVar66,auVar64);
          auVar66 = vpmovsxwd_avx2(auVar26._0_16_);
          auVar70 = vpmovsxwd_avx2(auVar64._0_16_);
          auVar66 = vpaddd_avx2(auVar66,auVar44);
          auVar66 = vpaddd_avx2(auVar66,auVar70);
          auVar26 = vpmovsxwd_avx2(auVar26._16_16_);
          auVar64 = vpmovsxwd_avx2(auVar64._16_16_);
          auVar26 = vpaddd_avx2(auVar26,auVar44);
          auVar26 = vpaddd_avx2(auVar26,auVar64);
          auVar64 = vpsrad_avx2(auVar66,7);
          auVar26 = vpsrad_avx2(auVar26,7);
          auVar26 = vpackusdw_avx2(auVar64,auVar26);
          auVar57 = vpermq_avx2(auVar57,0xd8);
          auVar26 = vpermq_avx2(auVar26,0xd8);
          auVar57 = vpackuswb_avx2(auVar57,auVar26);
          *pauVar11 = auVar57._0_16_;
          *(undefined1 (*) [16])(*pauVar11 + out_stride) = auVar57._16_16_;
          uVar4 = iVar15 + 7U;
          if ((int)uVar19 < (int)(iVar15 + 7U)) {
            uVar4 = uVar19;
          }
          uVar5 = iVar15 + 8U;
          if ((int)uVar19 < (int)(iVar15 + 8U)) {
            uVar5 = uVar19;
          }
          auVar24 = *(undefined1 (*) [16])(intbuf + (int)(uVar4 * stride) + lVar18);
          auVar60 = ZEXT1664(auVar24);
          auVar61 = *(undefined1 (*) [16])(intbuf + (int)(uVar5 * stride) + lVar18);
          auVar69 = ZEXT1664(auVar61);
          auVar27._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar32;
          auVar27._16_16_ = ZEXT116(1) * auVar24;
          auVar65._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar25;
          auVar65._16_16_ = ZEXT116(1) * auVar61;
          auVar57 = vpunpcklbw_avx2(auVar27,auVar65);
          auVar63 = ZEXT3264(auVar57);
          auVar57 = vpunpckhbw_avx2(auVar27,auVar65);
          auVar68 = ZEXT3264(auVar57);
          uVar21 = uVar21 + 4;
          pauVar11 = (undefined1 (*) [16])(*pauVar11 + (long)out_stride * 2);
          auVar57 = auVar37;
        } while (uVar21 < (uint)(height - iVar10));
        auVar57._8_2_ = 0xfdff;
        auVar57._0_8_ = 0xfdfffdfffdfffdff;
        auVar57._10_2_ = 0xfdff;
        auVar57._12_2_ = 0xfdff;
        auVar57._14_2_ = 0xfdff;
        auVar57._16_2_ = 0xfdff;
        auVar57._18_2_ = 0xfdff;
        auVar57._20_2_ = 0xfdff;
        auVar57._22_2_ = 0xfdff;
        auVar57._24_2_ = 0xfdff;
        auVar57._26_2_ = 0xfdff;
        auVar57._28_2_ = 0xfdff;
        auVar57._30_2_ = 0xfdff;
        auVar8._8_2_ = 0xfffd;
        auVar8._0_8_ = 0xfffdfffdfffdfffd;
        auVar8._10_2_ = 0xfffd;
        auVar8._12_2_ = 0xfffd;
        auVar8._14_2_ = 0xfffd;
        auVar8._16_2_ = 0xfffd;
        auVar8._18_2_ = 0xfffd;
        auVar8._20_2_ = 0xfffd;
        auVar8._22_2_ = 0xfffd;
        auVar8._24_2_ = 0xfffd;
        auVar8._26_2_ = 0xfffd;
        auVar8._28_2_ = 0xfffd;
        auVar8._30_2_ = 0xfffd;
        uVar21 = (ulong)(height & 0x7ffffffc) - 2;
        if ((uint)(height - iVar10) < uVar19) {
          while( true ) {
            auVar1._8_2_ = 0x380c;
            auVar1._0_8_ = 0x380c380c380c380c;
            auVar1._10_2_ = 0x380c;
            auVar1._12_2_ = 0x380c;
            auVar1._14_2_ = 0x380c;
            auVar1._16_2_ = 0x380c;
            auVar1._18_2_ = 0x380c;
            auVar1._20_2_ = 0x380c;
            auVar1._22_2_ = 0x380c;
            auVar1._24_2_ = 0x380c;
            auVar1._26_2_ = 0x380c;
            auVar1._28_2_ = 0x380c;
            auVar1._30_2_ = 0x380c;
            auVar26 = auVar56._0_32_;
            iVar15 = (int)uVar21;
            uVar4 = iVar15 + 3U;
            if ((int)uVar19 < (int)(iVar15 + 3U)) {
              uVar4 = uVar19;
            }
            uVar5 = iVar15 + 4U;
            if ((int)uVar19 < (int)(iVar15 + 4U)) {
              uVar5 = uVar19;
            }
            auVar32 = *(undefined1 (*) [16])(intbuf + (int)(uVar4 * stride) + lVar18);
            auVar28._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar60._0_16_;
            auVar28._16_16_ = ZEXT116(0) * auVar60._16_16_ + ZEXT116(1) * auVar32;
            auVar25 = *(undefined1 (*) [16])(intbuf + (int)(uVar5 * stride) + lVar18);
            auVar60 = ZEXT1664(auVar25);
            auVar53._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar69._0_16_;
            auVar53._16_16_ = ZEXT116(0) * auVar69._16_16_ + ZEXT116(1) * auVar25;
            auVar64 = vpmaddubsw_avx2(auVar51._0_32_,auVar1);
            auVar70 = vpunpcklbw_avx2(auVar28,auVar53);
            auVar51 = ZEXT3264(auVar70);
            auVar3 = vpunpckhbw_avx2(auVar28,auVar53);
            auVar56 = ZEXT3264(auVar3);
            auVar37 = vpmaddubsw_avx2(auVar37,auVar57);
            auVar64 = vpaddw_avx2(auVar64,auVar37);
            auVar37 = auVar63._0_32_;
            auVar66 = vpmaddubsw_avx2(auVar37,auVar39);
            auVar70 = vpmaddubsw_avx2(auVar70,auVar8);
            auVar66 = vpaddw_avx2(auVar70,auVar66);
            auVar70 = vpmovsxwd_avx2(auVar64._0_16_);
            auVar52 = vpmovsxwd_avx2(auVar66._0_16_);
            auVar70 = vpaddd_avx2(auVar70,auVar44);
            auVar70 = vpaddd_avx2(auVar70,auVar52);
            auVar52 = vpmaddubsw_avx2(auVar26,auVar1);
            auVar2 = vpmaddubsw_avx2(auVar48._0_32_,auVar57);
            auVar48 = ZEXT3264(auVar68._0_32_);
            auVar26 = vpmovsxwd_avx2(auVar64._16_16_);
            auVar64 = vpmovsxwd_avx2(auVar66._16_16_);
            auVar26 = vpaddd_avx2(auVar26,auVar44);
            auVar26 = vpaddd_avx2(auVar64,auVar26);
            auVar64 = vpsrad_avx2(auVar70,7);
            auVar26 = vpsrad_avx2(auVar26,7);
            auVar26 = vpackusdw_avx2(auVar64,auVar26);
            auVar64 = vpaddw_avx2(auVar52,auVar2);
            auVar66 = vpmaddubsw_avx2(auVar68._0_32_,auVar39);
            auVar70 = vpmaddubsw_avx2(auVar3,auVar8);
            auVar66 = vpaddw_avx2(auVar70,auVar66);
            auVar70 = vpmovsxwd_avx2(auVar64._0_16_);
            auVar52 = vpmovsxwd_avx2(auVar66._0_16_);
            auVar70 = vpaddd_avx2(auVar70,auVar44);
            auVar70 = vpaddd_avx2(auVar70,auVar52);
            auVar64 = vpmovsxwd_avx2(auVar64._16_16_);
            auVar66 = vpmovsxwd_avx2(auVar66._16_16_);
            auVar64 = vpaddd_avx2(auVar64,auVar44);
            auVar64 = vpaddd_avx2(auVar64,auVar66);
            auVar66 = vpsrad_avx2(auVar70,7);
            auVar64 = vpsrad_avx2(auVar64,7);
            auVar64 = vpackusdw_avx2(auVar66,auVar64);
            auVar26 = vpermq_avx2(auVar26,0xd8);
            auVar64 = vpermq_avx2(auVar64,0xd8);
            auVar26 = vpackuswb_avx2(auVar26,auVar64);
            *(undefined1 (*) [16])(output + (int)((iVar15 - 2U >> 1) * out_stride) + lVar18) =
                 auVar26._0_16_;
            if ((long)uVar21 < (long)(ulong)uVar19) {
              *(undefined1 (*) [16])
               (output + (int)(((uint)(uVar21 >> 1) & 0x7fffffff) * out_stride) + lVar18) =
                   auVar26._16_16_;
            }
            if ((long)(ulong)uVar19 <= (long)(uVar21 + 2)) break;
            auVar24 = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar32;
            auVar61 = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar25;
            auVar29._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar24;
            auVar29._16_16_ = ZEXT116(0) * ZEXT116(1) * auVar32 + ZEXT116(1) * auVar61;
            auVar67._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar25;
            auVar67._16_16_ = ZEXT116(1) * auVar25;
            auVar26 = vpunpcklbw_avx2(auVar29,auVar67);
            auVar63 = ZEXT3264(auVar26);
            auVar26 = vpunpckhbw_avx2(auVar29,auVar67);
            auVar68 = ZEXT3264(auVar26);
            auVar69 = ZEXT1664(auVar25);
            uVar21 = uVar21 + 4;
          }
        }
        auVar37 = (undefined1  [32])0x0;
        lVar18 = lVar18 + 0x10;
        pauVar16 = pauVar16 + 1;
      } while (lVar18 < (int)(uVar17 & 0xfffffff0));
    }
    if (7 < iVar14) {
      lVar18 = (long)((int)uVar17 >> 4) * 0x10;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(intbuf + lVar12 + lVar18);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = *(ulong *)(intbuf + lVar12 * 2 + lVar18);
      auVar32 = vpunpcklbw_avx(auVar32,auVar61);
      auVar46 = ZEXT864(*(ulong *)(intbuf + lVar12 * 3 + lVar18));
      auVar48 = ZEXT864(*(ulong *)(intbuf + lVar12 * 4 + lVar18));
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)(intbuf + lVar18);
      auVar25 = vpunpcklbw_avx(auVar25,auVar25);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)(intbuf + lVar12 * 3 + lVar18);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = *(ulong *)(intbuf + lVar12 * 4 + lVar18);
      auVar24 = vpunpcklbw_avx(auVar24,auVar41);
      auVar51._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar25;
      auVar51._16_16_ = ZEXT116(1) * auVar25;
      auVar51._32_32_ = auVar37;
      auVar40 = ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                    ZEXT116(1) * auVar32,ZEXT116(0) * auVar32 + ZEXT116(1) * auVar25
                                   ));
      auVar37._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar32;
      auVar37._16_16_ = ZEXT116(1) * auVar24;
      iVar15 = height + -1;
      uVar17 = height - iVar10;
      uVar21 = (ulong)uVar17;
      if (uVar17 != 0 && iVar10 <= height) {
        puVar22 = output + lVar18;
        uVar20 = 0;
        auVar44._8_2_ = 0xfdff;
        auVar44._0_8_ = 0xfdfffdfffdfffdff;
        auVar44._10_2_ = 0xfdff;
        auVar44._12_2_ = 0xfdff;
        auVar44._14_2_ = 0xfdff;
        auVar44._16_2_ = 0xfdff;
        auVar44._18_2_ = 0xfdff;
        auVar44._20_2_ = 0xfdff;
        auVar44._22_2_ = 0xfdff;
        auVar44._24_2_ = 0xfdff;
        auVar44._26_2_ = 0xfdff;
        auVar44._28_2_ = 0xfdff;
        auVar44._30_2_ = 0xfdff;
        auVar49._8_2_ = 0x380c;
        auVar49._0_8_ = 0x380c380c380c380c;
        auVar49._10_2_ = 0x380c;
        auVar49._12_2_ = 0x380c;
        auVar49._14_2_ = 0x380c;
        auVar49._16_2_ = 0x380c;
        auVar49._18_2_ = 0x380c;
        auVar49._20_2_ = 0x380c;
        auVar49._22_2_ = 0x380c;
        auVar49._24_2_ = 0x380c;
        auVar49._26_2_ = 0x380c;
        auVar49._28_2_ = 0x380c;
        auVar49._30_2_ = 0x380c;
        auVar54._8_2_ = 0xc38;
        auVar54._0_8_ = 0xc380c380c380c38;
        auVar54._10_2_ = 0xc38;
        auVar54._12_2_ = 0xc38;
        auVar54._14_2_ = 0xc38;
        auVar54._16_2_ = 0xc38;
        auVar54._18_2_ = 0xc38;
        auVar54._20_2_ = 0xc38;
        auVar54._22_2_ = 0xc38;
        auVar54._24_2_ = 0xc38;
        auVar54._26_2_ = 0xc38;
        auVar54._28_2_ = 0xc38;
        auVar54._30_2_ = 0xc38;
        auVar58._8_2_ = 0xfffd;
        auVar58._0_8_ = 0xfffdfffdfffdfffd;
        auVar58._10_2_ = 0xfffd;
        auVar58._12_2_ = 0xfffd;
        auVar58._14_2_ = 0xfffd;
        auVar58._16_2_ = 0xfffd;
        auVar58._18_2_ = 0xfffd;
        auVar58._20_2_ = 0xfffd;
        auVar58._22_2_ = 0xfffd;
        auVar58._24_2_ = 0xfffd;
        auVar58._26_2_ = 0xfffd;
        auVar58._28_2_ = 0xfffd;
        auVar58._30_2_ = 0xfffd;
        auVar62._8_4_ = 0x40;
        auVar62._0_8_ = 0x4000000040;
        auVar62._12_4_ = 0x40;
        auVar62._16_4_ = 0x40;
        auVar62._20_4_ = 0x40;
        auVar62._24_4_ = 0x40;
        auVar62._28_4_ = 0x40;
        auVar57 = auVar37;
        do {
          auVar37 = vpmaddubsw_avx2(auVar40._0_32_,auVar49);
          auVar26 = vpmaddubsw_avx2(auVar51._0_32_,auVar44);
          auVar37 = vpaddw_avx2(auVar37,auVar26);
          auVar32 = vpunpcklbw_avx(auVar46._0_16_,auVar48._0_16_);
          iVar10 = (int)uVar20;
          iVar14 = iVar10 + 5;
          if (iVar15 < iVar10 + 5) {
            iVar14 = iVar15;
          }
          iVar6 = iVar10 + 6;
          if (iVar15 < iVar10 + 6) {
            iVar6 = iVar15;
          }
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *(ulong *)(intbuf + iVar14 * stride + lVar18);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)(intbuf + iVar6 * stride + lVar18);
          auVar25 = vpunpcklbw_avx(auVar33,auVar38);
          auVar30._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar32;
          auVar30._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar25;
          auVar40 = ZEXT3264(auVar30);
          auVar26 = vpmaddubsw_avx2(auVar57,auVar54);
          auVar64 = vpmaddubsw_avx2(auVar30,auVar58);
          auVar26 = vpaddw_avx2(auVar64,auVar26);
          auVar64 = vpmovsxwd_avx2(auVar37._0_16_);
          auVar66 = vpmovsxwd_avx2(auVar37._16_16_);
          auVar70 = vpmovsxwd_avx2(auVar26._0_16_);
          auVar52 = vpmovsxwd_avx2(auVar26._16_16_);
          auVar37 = vpaddd_avx2(auVar62,auVar64);
          auVar37 = vpaddd_avx2(auVar70,auVar37);
          auVar26 = vpaddd_avx2(auVar66,auVar62);
          auVar26 = vpaddd_avx2(auVar26,auVar52);
          auVar64 = vpsrad_avx2(auVar37,7);
          auVar37 = vpsrad_avx2(auVar26,7);
          auVar37 = vpackusdw_avx2(auVar64,auVar37);
          auVar37 = vpermq_avx2(auVar37,0xd8);
          auVar37 = vpackuswb_avx2(auVar37,auVar30);
          *(long *)puVar22 = auVar37._0_8_;
          *(long *)(puVar22 + out_stride) = auVar37._16_8_;
          iVar14 = iVar10 + 7;
          if (iVar15 < iVar10 + 7) {
            iVar14 = iVar15;
          }
          iVar6 = iVar10 + 8;
          if (iVar15 < iVar10 + 8) {
            iVar6 = iVar15;
          }
          auVar46 = ZEXT864(*(ulong *)(intbuf + iVar14 * stride + lVar18));
          auVar48 = ZEXT864(*(ulong *)(intbuf + iVar6 * stride + lVar18));
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)(intbuf + iVar14 * stride + lVar18);
          auVar42._8_8_ = 0;
          auVar42._0_8_ = *(ulong *)(intbuf + iVar6 * stride + lVar18);
          auVar32 = vpunpcklbw_avx(auVar34,auVar42);
          auVar37._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar25;
          auVar37._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar32;
          uVar20 = uVar20 + 4;
          puVar22 = puVar22 + (long)out_stride * 2;
          auVar51 = ZEXT3264(auVar57);
          auVar57 = auVar37;
        } while (uVar20 < uVar21);
      }
      iVar14 = stride % 8;
      if ((int)uVar17 < iVar15) {
        iVar10 = height - (height & 2U);
        lVar12 = 0;
        auVar45._8_2_ = 0xfdff;
        auVar45._0_8_ = 0xfdfffdfffdfffdff;
        auVar45._10_2_ = 0xfdff;
        auVar45._12_2_ = 0xfdff;
        auVar45._14_2_ = 0xfdff;
        auVar45._16_2_ = 0xfdff;
        auVar45._18_2_ = 0xfdff;
        auVar45._20_2_ = 0xfdff;
        auVar45._22_2_ = 0xfdff;
        auVar45._24_2_ = 0xfdff;
        auVar45._26_2_ = 0xfdff;
        auVar45._28_2_ = 0xfdff;
        auVar45._30_2_ = 0xfdff;
        auVar47._8_2_ = 0x380c;
        auVar47._0_8_ = 0x380c380c380c380c;
        auVar47._10_2_ = 0x380c;
        auVar47._12_2_ = 0x380c;
        auVar47._14_2_ = 0x380c;
        auVar47._16_2_ = 0x380c;
        auVar47._18_2_ = 0x380c;
        auVar47._20_2_ = 0x380c;
        auVar47._22_2_ = 0x380c;
        auVar47._24_2_ = 0x380c;
        auVar47._26_2_ = 0x380c;
        auVar47._28_2_ = 0x380c;
        auVar47._30_2_ = 0x380c;
        auVar50._8_2_ = 0xc38;
        auVar50._0_8_ = 0xc380c380c380c38;
        auVar50._10_2_ = 0xc38;
        auVar50._12_2_ = 0xc38;
        auVar50._14_2_ = 0xc38;
        auVar50._16_2_ = 0xc38;
        auVar50._18_2_ = 0xc38;
        auVar50._20_2_ = 0xc38;
        auVar50._22_2_ = 0xc38;
        auVar50._24_2_ = 0xc38;
        auVar50._26_2_ = 0xc38;
        auVar50._28_2_ = 0xc38;
        auVar50._30_2_ = 0xc38;
        auVar55._8_2_ = 0xfffd;
        auVar55._0_8_ = 0xfffdfffdfffdfffd;
        auVar55._10_2_ = 0xfffd;
        auVar55._12_2_ = 0xfffd;
        auVar55._14_2_ = 0xfffd;
        auVar55._16_2_ = 0xfffd;
        auVar55._18_2_ = 0xfffd;
        auVar55._20_2_ = 0xfffd;
        auVar55._22_2_ = 0xfffd;
        auVar55._24_2_ = 0xfffd;
        auVar55._26_2_ = 0xfffd;
        auVar55._28_2_ = 0xfffd;
        auVar55._30_2_ = 0xfffd;
        auVar59._8_4_ = 0x40;
        auVar59._0_8_ = 0x4000000040;
        auVar59._12_4_ = 0x40;
        auVar59._16_4_ = 0x40;
        auVar59._20_4_ = 0x40;
        auVar59._24_4_ = 0x40;
        auVar59._28_4_ = 0x40;
        while( true ) {
          auVar57 = vpmaddubsw_avx2(auVar40._0_32_,auVar47);
          auVar26 = vpmaddubsw_avx2(auVar51._0_32_,auVar45);
          auVar57 = vpaddw_avx2(auVar26,auVar57);
          auVar32 = vpunpcklbw_avx(auVar46._0_16_,auVar48._0_16_);
          iVar6 = (int)lVar12;
          iVar13 = iVar10 + iVar6 + 1;
          if (iVar15 < iVar13) {
            iVar13 = iVar15;
          }
          iVar23 = iVar10 + iVar6 + 2;
          if (iVar15 < iVar23) {
            iVar23 = iVar15;
          }
          uVar20 = *(ulong *)(intbuf + iVar23 * stride + lVar18);
          auVar46 = ZEXT864(uVar20);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = uVar20;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = *(ulong *)(intbuf + iVar13 * stride + lVar18);
          auVar25 = vpunpcklbw_avx(auVar43,auVar35);
          auVar31._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar32;
          auVar31._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar25;
          auVar40 = ZEXT3264(auVar31);
          auVar26 = vpmaddubsw_avx2(auVar37,auVar50);
          auVar64 = vpmaddubsw_avx2(auVar31,auVar55);
          auVar26 = vpaddw_avx2(auVar64,auVar26);
          auVar64 = vpmovsxwd_avx2(auVar57._0_16_);
          auVar66 = vpmovsxwd_avx2(auVar57._16_16_);
          auVar70 = vpmovsxwd_avx2(auVar26._0_16_);
          auVar52 = vpmovsxwd_avx2(auVar26._16_16_);
          auVar57 = vpaddd_avx2(auVar64,auVar59);
          auVar57 = vpaddd_avx2(auVar57,auVar70);
          auVar26 = vpaddd_avx2(auVar66,auVar59);
          auVar26 = vpaddd_avx2(auVar26,auVar52);
          auVar64 = vpsrad_avx2(auVar57,7);
          auVar57 = vpsrad_avx2(auVar26,7);
          auVar57 = vpackusdw_avx2(auVar64,auVar57);
          auVar57 = vpermq_avx2(auVar57,0xd8);
          auVar57 = vpackuswb_avx2(auVar57,auVar31);
          *(long *)(output + (int)(((uint)(uVar21 + lVar12 >> 1) & 0x7fffffff) * out_stride +
                                  (int)lVar18)) = auVar57._0_8_;
          if ((long)(uVar21 + lVar12 + 2) < (long)iVar15) {
            *(long *)(output + (int)(((uint)(iVar10 + -2 + iVar6) >> 1) * out_stride + (int)lVar18))
                 = auVar57._16_8_;
          }
          if ((long)iVar15 <= (long)(uVar21 + lVar12 + 4)) break;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = uVar20;
          auVar32 = vpunpcklbw_avx(auVar35,auVar36);
          auVar51 = ZEXT3264(auVar37);
          auVar37._0_16_ =
               ZEXT116(0) * auVar32 +
               ZEXT116(1) * (ZEXT116(0) * auVar31._0_16_ + ZEXT116(1) * auVar25);
          auVar37._16_16_ =
               ZEXT116(0) *
               (ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar31._0_16_) +
               ZEXT116(1) * auVar32;
          lVar12 = lVar12 + 4;
          auVar48 = ZEXT1664(auVar36);
        }
      }
    }
    if (iVar14 == 0) {
      return true;
    }
    start_col = stride - iVar14;
  }
  _Var9 = av1_resize_vert_dir_c(intbuf,output,out_stride,height,height2,stride,start_col);
  return _Var9;
}

Assistant:

bool av1_resize_vert_dir_avx2(uint8_t *intbuf, uint8_t *output, int out_stride,
                              int height, int height2, int stride,
                              int start_col) {
  assert(start_col <= stride);
  // For the GM tool, the input layer height or width is assured to be an even
  // number. Hence the function 'down2_symodd()' is not invoked and SIMD
  // optimization of the same is not implemented.
  // When the input height is less than 8 and even, the potential input
  // heights are limited to 2, 4, or 6. These scenarios require seperate
  // handling due to padding requirements. Invoking the C function here will
  // eliminate the need for conditional statements within the subsequent SIMD
  // code to manage these cases.
  if (height & 1 || height < 8) {
    return av1_resize_vert_dir_c(intbuf, output, out_stride, height, height2,
                                 stride, start_col);
  }

  __m256i s[10], coeffs_y[4];
  const int bits = FILTER_BITS;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const uint8_t max_pixel = 255;
  const __m256i clip_pixel = _mm256_set1_epi8((char)max_pixel);
  const __m256i zero = _mm256_setzero_si256();

  prepare_filter_coeffs(av1_down2_symeven_half_filter, coeffs_y);

  const int num_col16 = stride / 16;
  int remain_col = stride % 16;
  // The core vertical SIMD processes 4 input rows simultaneously to generate
  // output corresponding to 2 rows. To streamline the core loop and eliminate
  // the need for conditional checks, the remaining rows (4 or 6) are processed
  // separately.
  const int remain_row = (height % 4 == 0) ? 4 : 6;

  for (int j = start_col; j < stride - remain_col; j += 16) {
    const uint8_t *data = &intbuf[j];
    const __m128i l3 = _mm_loadu_si128((__m128i *)(data + 0 * stride));
    // Padding top 3 rows with the last available row at the top.
    const __m128i l0 = l3;
    const __m128i l1 = l3;
    const __m128i l2 = l3;
    const __m128i l4 = _mm_loadu_si128((__m128i *)(data + 1 * stride));

    __m128i l6, l7, l8, l9;
    __m128i l5 = _mm_loadu_si128((__m128i *)(data + 2 * stride));
    __m128i l10 = _mm_loadu_si128((__m128i *)(data + 3 * stride));
    __m128i l11 = _mm_loadu_si128((__m128i *)(data + 4 * stride));

    // a0...a15 | c0...c15
    const __m256i s02 =
        _mm256_permute2x128_si256(CAST_HI(l0), CAST_HI(l2), 0x20);
    // b0...b15 | d0...d15
    const __m256i s13 =
        _mm256_permute2x128_si256(CAST_HI(l1), CAST_HI(l3), 0x20);
    // c0...c15 | e0...e15
    const __m256i s24 =
        _mm256_permute2x128_si256(CAST_HI(l2), CAST_HI(l4), 0x20);
    // d0...d15 | f0...f15
    const __m256i s35 =
        _mm256_permute2x128_si256(CAST_HI(l3), CAST_HI(l5), 0x20);
    // e0...e15 | g0...g15
    const __m256i s46 =
        _mm256_permute2x128_si256(CAST_HI(l4), CAST_HI(l10), 0x20);
    // f0...f15 | h0...h15
    const __m256i s57 =
        _mm256_permute2x128_si256(CAST_HI(l5), CAST_HI(l11), 0x20);

    // a0b0...a7b7 | c0d0...c7d7
    s[0] = _mm256_unpacklo_epi8(s02, s13);
    // c0d0...c7d7 | e0f0...e7f7
    s[1] = _mm256_unpacklo_epi8(s24, s35);
    // e0f0...e7f7 | g0h0...g7h7
    s[2] = _mm256_unpacklo_epi8(s46, s57);

    // a8b8...a15b15 | c8d8...c15d15
    s[5] = _mm256_unpackhi_epi8(s02, s13);
    // c8d8...c15d15 | e8f8...e15f15
    s[6] = _mm256_unpackhi_epi8(s24, s35);
    // e8f8...e15f15 | g8h8...g15h15
    s[7] = _mm256_unpackhi_epi8(s46, s57);

    // height to be processed here
    const int process_ht = height - remain_row;
    for (int i = 0; i < process_ht; i += 4) {
      PROCESS_RESIZE_Y_WD16

      _mm_storeu_si128((__m128i *)&output[(i / 2) * out_stride + j],
                       CAST_LOW(res_8bit0));

      _mm_storeu_si128(
          (__m128i *)&output[(i / 2) * out_stride + j + out_stride],
          _mm256_extracti128_si256(res_8bit0, 1));

      // Load the required data for processing of next 4 input rows.
      const int idx7 = AOMMIN(height - 1, i + 7);
      const int idx8 = AOMMIN(height - 1, i + 8);
      l10 = _mm_loadu_si128((__m128i *)(data + idx7 * stride));
      l11 = _mm_loadu_si128((__m128i *)(data + idx8 * stride));

      const __m256i s810 =
          _mm256_permute2x128_si256(CAST_HI(l8), CAST_HI(l10), 0x20);
      const __m256i s911 =
          _mm256_permute2x128_si256(CAST_HI(l9), CAST_HI(l11), 0x20);
      // i0j0... i7j7 | k0l0... k7l7
      s[4] = _mm256_unpacklo_epi8(s810, s911);
      // i8j8... i15j15 | k8l8... k15l15
      s[9] = _mm256_unpackhi_epi8(s810, s911);

      s[0] = s[2];
      s[1] = s[3];
      s[2] = s[4];

      s[5] = s[7];
      s[6] = s[8];
      s[7] = s[9];
    }

    // Process the remaining last 4 or 6 rows here.
    int i = process_ht;
    while (i < height - 1) {
      PROCESS_RESIZE_Y_WD16

      _mm_storeu_si128((__m128i *)&output[(i / 2) * out_stride + j],
                       CAST_LOW(res_8bit0));
      i += 2;

      const int is_store_valid = (i < height - 1);
      if (is_store_valid)
        _mm_storeu_si128((__m128i *)&output[(i / 2) * out_stride + j],
                         _mm256_extracti128_si256(res_8bit0, 1));
      i += 2;

      // Check if there is any remaining height to process. If so, perform the
      // necessary data loading for processing the next row.
      if (i < height - 1) {
        l10 = l11 = l9;
        const __m256i s810 =
            _mm256_permute2x128_si256(CAST_HI(l8), CAST_HI(l10), 0x20);
        const __m256i s911 =
            _mm256_permute2x128_si256(CAST_HI(l9), CAST_HI(l11), 0x20);
        // i0j0... i7j7 | k0l0... k7l7
        s[4] = _mm256_unpacklo_epi8(s810, s911);
        // i8j8... i15j15 | k8l8... k15l15
        s[9] = _mm256_unpackhi_epi8(s810, s911);

        s[0] = s[2];
        s[1] = s[3];
        s[2] = s[4];

        s[5] = s[7];
        s[6] = s[8];
        s[7] = s[9];
      }
    }
  }

  if (remain_col > 7) {
    const int processed_wd = num_col16 * 16;
    remain_col = stride % 8;

    const uint8_t *data = &intbuf[processed_wd];

    const __m128i l3 = _mm_loadl_epi64((__m128i *)(data + 0 * stride));
    // Padding top 3 rows with available top-most row.
    const __m128i l0 = l3;
    const __m128i l1 = l3;
    const __m128i l2 = l3;
    const __m128i l4 = _mm_loadl_epi64((__m128i *)(data + 1 * stride));

    __m128i l6, l7, l8, l9;
    __m128i l5 = _mm_loadl_epi64((__m128i *)(data + 2 * stride));
    __m128i l10 = _mm_loadl_epi64((__m128i *)(data + 3 * stride));
    __m128i l11 = _mm_loadl_epi64((__m128i *)(data + 4 * stride));

    // a0b0...a7b7
    const __m128i s01 = _mm_unpacklo_epi8(l0, l1);
    // c0d0...c7d7
    const __m128i s23 = _mm_unpacklo_epi8(l2, l3);
    // e0f0...e7f7
    const __m128i s45 = _mm_unpacklo_epi8(l4, l5);
    // g0h0...g7h7
    __m128i s67 = _mm_unpacklo_epi8(l10, l11);

    // a0b0...a7b7 | c0d0...c7d7
    s[0] = _mm256_permute2x128_si256(CAST_HI(s01), CAST_HI(s23), 0x20);
    // c0d0...c7d7 | e0f0...e7f7
    s[1] = _mm256_permute2x128_si256(CAST_HI(s23), CAST_HI(s45), 0x20);
    // e0f0...e7f7 | g0h0...g7h7
    s[2] = _mm256_permute2x128_si256(CAST_HI(s45), CAST_HI(s67), 0x20);

    // height to be processed here
    const int process_ht = height - remain_row;
    for (int i = 0; i < process_ht; i += 4) {
      PROCESS_RESIZE_Y_WD8

      _mm_storel_epi64((__m128i *)&output[(i / 2) * out_stride + processed_wd],
                       CAST_LOW(res_a_round_1));

      _mm_storel_epi64(
          (__m128i *)&output[(i / 2) * out_stride + processed_wd + out_stride],
          _mm256_extracti128_si256(res_a_round_1, 1));

      const int idx7 = AOMMIN(height - 1, i + 7);
      const int idx8 = AOMMIN(height - 1, i + 8);
      l10 = _mm_loadl_epi64((__m128i *)(data + idx7 * stride));
      l11 = _mm_loadl_epi64((__m128i *)(data + idx8 * stride));

      // k0l0... k7l7
      const __m128i s10s11 = _mm_unpacklo_epi8(l10, l11);
      // i0j0... i7j7 | k0l0... k7l7
      s[4] = _mm256_permute2x128_si256(CAST_HI(s89), CAST_HI(s10s11), 0x20);

      s[0] = s[2];
      s[1] = s[3];
      s[2] = s[4];
    }

    // Process the remaining last 4 or 6 rows here.
    int i = process_ht;
    while (i < height - 1) {
      PROCESS_RESIZE_Y_WD8

      _mm_storel_epi64((__m128i *)&output[(i / 2) * out_stride + processed_wd],
                       CAST_LOW(res_a_round_1));

      i += 2;

      const int is_store_valid = (i < height - 1);
      if (is_store_valid)
        _mm_storel_epi64(
            (__m128i *)&output[(i / 2) * out_stride + processed_wd],
            _mm256_extracti128_si256(res_a_round_1, 1));
      i += 2;

      // Check rows are still remaining for processing. If yes do the required
      // load of data for the next iteration.
      if (i < height - 1) {
        l10 = l11 = l9;
        // k0l0... k7l7
        const __m128i s10s11 = _mm_unpacklo_epi8(l10, l11);
        // i0j0... i7j7 | k0l0... k7l7
        s[4] = _mm256_permute2x128_si256(CAST_HI(s89), CAST_HI(s10s11), 0x20);

        s[0] = s[2];
        s[1] = s[3];
        s[2] = s[4];
      }
    }
  }

  if (remain_col)
    return av1_resize_vert_dir_c(intbuf, output, out_stride, height, height2,
                                 stride, stride - remain_col);

  return true;
}